

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aarect.h
# Opt level: O0

long __thiscall xz_rect::random(xz_rect *this)

{
  double e1;
  double in_RDX;
  long in_RSI;
  double e0;
  double e2;
  undefined1 local_30 [8];
  vec3 random_point;
  vec3 *origin_local;
  xz_rect *this_local;
  
  random_point.e[2] = in_RDX;
  e0 = random_double(*(double *)(in_RSI + 0x18),*(double *)(in_RSI + 0x20));
  e1 = *(double *)(in_RSI + 0x38);
  e2 = random_double(*(double *)(in_RSI + 0x28),*(double *)(in_RSI + 0x30));
  vec3::vec3((vec3 *)local_30,e0,e1,e2);
  operator-((vec3 *)this,(vec3 *)local_30,(vec3 *)random_point.e[2]);
  return (long)this;
}

Assistant:

virtual vec3 random(const vec3& origin) const override {
        auto random_point = vec3(random_double(x0,x1), k, random_double(z0,z1));
        return random_point - origin;
    }